

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torcontrol.cpp
# Opt level: O1

void __thiscall
TorController::get_socks_cb(TorController *this,TorControlConnection *_conn,TorControlReply *reply)

{
  pointer *ppbVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  char cVar3;
  long lVar4;
  pointer pbVar5;
  size_type sVar6;
  DNSLookupFn dns_lookup_function;
  DNSLookupFn dns_lookup_function_00;
  pointer pbVar7;
  bool bVar8;
  int iVar9;
  Network NVar10;
  Logger *pLVar11;
  char *pcVar12;
  pointer this_00;
  string *net_in;
  long lVar13;
  char *in_R8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_01;
  string *psVar14;
  long in_FS_OFFSET;
  string_view logging_function;
  string_view logging_function_00;
  string_view logging_function_01;
  string_view logging_function_02;
  string_view source_file;
  string_view source_file_00;
  string_view source_file_01;
  string_view source_file_02;
  string_view separators;
  pointer local_158;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  onlynets;
  _Any_data local_138;
  code *local_128;
  _Any_data local_118;
  code *local_108;
  Proxy addrOnion;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  port_list;
  CService resolved;
  string socks_location;
  
  lVar4 = *(long *)(in_FS_OFFSET + 0x28);
  socks_location._M_dataplus._M_p = (pointer)&socks_location.field_2;
  socks_location._M_string_length = 0;
  socks_location.field_2._M_local_buf[0] = '\0';
  if (reply->code == 0x1fe) {
    pcVar12 = 
    "tor: Get SOCKS port command failed with unrecognized command (You probably should upgrade Tor)\n"
    ;
    iVar9 = 0x17f;
LAB_003cca54:
    logging_function_01._M_str = "get_socks_cb";
    logging_function_01._M_len = 0xc;
    source_file_01._M_str =
         "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/torcontrol.cpp"
    ;
    source_file_01._M_len = 0x5e;
    LogPrintFormatInternal<>
              (logging_function_01,source_file_01,iVar9,ALL,Info,(ConstevalFormatString<0U>)pcVar12)
    ;
  }
  else if (reply->code == 0xfa) {
    this_00 = (reply->lines).
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pbVar5 = (reply->lines).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (this_00 != pbVar5) {
      do {
        iVar9 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                compare(this_00,0,0x14,"net/listeners/socks=");
        if (iVar9 == 0) {
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&addrOnion
                     ,this_00,0x14,0xffffffffffffffff);
          resolved.super_CNetAddr.m_addr._union.indirect_contents.indirect =
               addrOnion.proxy.super_CNetAddr.m_addr._union.indirect_contents.indirect;
          onlynets.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start._0_1_ = 0x20;
          separators._M_str = in_R8;
          separators._M_len = (size_t)&onlynets;
          util::Split<std::__cxx11::string>
                    (&port_list,(util *)&resolved,(Span<const_char> *)0x1,separators);
          pbVar7 = port_list.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          for (this_01 = port_list.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start; this_01 != pbVar7;
              this_01 = this_01 + 1) {
            sVar6 = this_01->_M_string_length;
            iVar9 = 5;
            if (sVar6 != 0) {
              pcVar12 = (this_01->_M_dataplus)._M_p;
              cVar3 = *pcVar12;
              if ((((cVar3 == '\'') || (cVar3 == '\"')) && (sVar6 != 1)) &&
                 (pcVar12[sVar6 - 1] == cVar3)) {
                std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                substr((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &resolved,this_01,1,this_01->_M_string_length - 2);
                std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                operator=(this_01,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)&resolved);
                if ((size_type *)resolved.super_CNetAddr.m_addr._union.indirect_contents.indirect !=
                    &resolved.super_CNetAddr.m_addr._size) {
                  operator_delete(resolved.super_CNetAddr.m_addr._union.indirect_contents.indirect,
                                  CONCAT44(resolved.super_CNetAddr.m_addr._20_4_,
                                           resolved.super_CNetAddr.m_addr._size) + 1);
                }
                if (this_01->_M_string_length == 0) goto LAB_003cc8be;
              }
              std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              _M_assign(&socks_location,this_01);
              iVar9 = std::__cxx11::
                      basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                                (this_01,0,10,"127.0.0.1:");
              iVar9 = (uint)(iVar9 == 0) << 2;
            }
LAB_003cc8be:
            if ((iVar9 != 5) && (iVar9 != 0)) break;
          }
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&port_list);
          if ((size_type *)addrOnion.proxy.super_CNetAddr.m_addr._union.indirect_contents.indirect
              != &addrOnion.proxy.super_CNetAddr.m_addr._size) {
            operator_delete(addrOnion.proxy.super_CNetAddr.m_addr._union.indirect_contents.indirect,
                            CONCAT44(addrOnion.proxy.super_CNetAddr.m_addr._20_4_,
                                     addrOnion.proxy.super_CNetAddr.m_addr._size) + 1);
          }
        }
        this_00 = this_00 + 1;
        local_158 = pbVar5;
      } while (this_00 != pbVar5);
    }
    if (socks_location._M_string_length == 0) {
      pcVar12 = "tor: Get SOCKS port command returned nothing\n";
      iVar9 = 0x17c;
      goto LAB_003cca54;
    }
    pLVar11 = LogInstance();
    bVar8 = BCLog::Logger::WillLogCategoryLevel(pLVar11,TOR,Debug);
    if (bVar8) {
      logging_function._M_str = "get_socks_cb";
      logging_function._M_len = 0xc;
      source_file._M_str =
           "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/torcontrol.cpp"
      ;
      source_file._M_len = 0x5e;
      LogPrintFormatInternal<std::__cxx11::string>
                (logging_function,source_file,0x17a,TOR,Debug,(ConstevalFormatString<1U>)0x81e46a,
                 &socks_location);
    }
  }
  else {
    logging_function_00._M_str = "get_socks_cb";
    logging_function_00._M_len = 0xc;
    source_file_00._M_str =
         "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/torcontrol.cpp"
    ;
    source_file_00._M_len = 0x5e;
    LogPrintFormatInternal<int>
              (logging_function_00,source_file_00,0x181,ALL,Info,(ConstevalFormatString<1U>)0x81e51b
               ,&reply->code);
  }
  CService::CService(&resolved);
  CNetAddr::IsValid(&resolved.super_CNetAddr);
  if (socks_location._M_string_length != 0) {
    std::
    function<std::vector<CNetAddr,_std::allocator<CNetAddr>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_bool)>
    ::function((function<std::vector<CNetAddr,_std::allocator<CNetAddr>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_bool)>
                *)&local_118,&g_dns_lookup_abi_cxx11_);
    dns_lookup_function.super__Function_base._M_functor._M_pod_data[8] =
         onlynets.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start._0_1_;
    dns_lookup_function.super__Function_base._M_functor._M_unused._M_object = local_158;
    dns_lookup_function.super__Function_base._M_functor._9_7_ =
         onlynets.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start._1_7_;
    dns_lookup_function.super__Function_base._M_manager =
         (_Manager_type)
         onlynets.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    dns_lookup_function._M_invoker =
         (_Invoker_type)
         onlynets.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    LookupNumeric(&addrOnion.proxy,&socks_location,0x235a,dns_lookup_function);
    if (0x10 < resolved.super_CNetAddr.m_addr._size) {
      free(resolved.super_CNetAddr.m_addr._union.indirect_contents.indirect);
    }
    resolved.super_CNetAddr.m_addr._union.indirect_contents.indirect =
         addrOnion.proxy.super_CNetAddr.m_addr._union.indirect_contents.indirect;
    resolved.super_CNetAddr.m_addr._size = addrOnion.proxy.super_CNetAddr.m_addr._size;
    addrOnion.proxy.super_CNetAddr.m_addr._size = 0;
    resolved.super_CNetAddr.m_net = addrOnion.proxy.super_CNetAddr.m_net;
    resolved.super_CNetAddr.m_scope_id = addrOnion.proxy.super_CNetAddr.m_scope_id;
    resolved.port = addrOnion.proxy.port;
    if (local_108 != (code *)0x0) {
      (*local_108)(&local_118,&local_118,__destroy_functor);
    }
  }
  bVar8 = CNetAddr::IsValid(&resolved.super_CNetAddr);
  if (!bVar8) {
    ppbVar1 = &port_list.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
    port_list.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)ppbVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&port_list,"127.0.0.1","");
    std::
    function<std::vector<CNetAddr,_std::allocator<CNetAddr>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_bool)>
    ::function((function<std::vector<CNetAddr,_std::allocator<CNetAddr>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_bool)>
                *)&local_138,&g_dns_lookup_abi_cxx11_);
    dns_lookup_function_00.super__Function_base._M_functor._M_pod_data[8] =
         onlynets.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start._0_1_;
    dns_lookup_function_00.super__Function_base._M_functor._M_unused._M_object = local_158;
    dns_lookup_function_00.super__Function_base._M_functor._9_7_ =
         onlynets.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start._1_7_;
    dns_lookup_function_00.super__Function_base._M_manager =
         (_Manager_type)
         onlynets.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    dns_lookup_function_00._M_invoker =
         (_Invoker_type)
         onlynets.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    LookupNumeric(&addrOnion.proxy,(string *)&port_list,0x235a,dns_lookup_function_00);
    if (0x10 < resolved.super_CNetAddr.m_addr._size) {
      free(resolved.super_CNetAddr.m_addr._union.indirect_contents.indirect);
    }
    resolved.super_CNetAddr.m_addr._union.indirect_contents.indirect =
         addrOnion.proxy.super_CNetAddr.m_addr._union.indirect_contents.indirect;
    resolved.super_CNetAddr.m_addr._size = addrOnion.proxy.super_CNetAddr.m_addr._size;
    addrOnion.proxy.super_CNetAddr.m_addr._size = 0;
    resolved.super_CNetAddr.m_net = addrOnion.proxy.super_CNetAddr.m_net;
    resolved.super_CNetAddr.m_scope_id = addrOnion.proxy.super_CNetAddr.m_scope_id;
    resolved.port = addrOnion.proxy.port;
    if (local_128 != (code *)0x0) {
      (*local_128)(&local_138,&local_138,__destroy_functor);
    }
    if (port_list.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)ppbVar1) {
      operator_delete(port_list.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (ulong)((long)&((port_list.
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                                     _M_dataplus)._M_p + 1));
    }
  }
  CNetAddr::IsValid(&resolved.super_CNetAddr);
  pLVar11 = LogInstance();
  bVar8 = BCLog::Logger::WillLogCategoryLevel(pLVar11,TOR,Debug);
  if (bVar8) {
    CService::ToStringAddrPort_abi_cxx11_((string *)&addrOnion,&resolved);
    logging_function_02._M_str = "get_socks_cb";
    logging_function_02._M_len = 0xc;
    source_file_02._M_str =
         "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/torcontrol.cpp"
    ;
    source_file_02._M_len = 0x5e;
    LogPrintFormatInternal<std::__cxx11::string>
              (logging_function_02,source_file_02,399,TOR,Debug,(ConstevalFormatString<1U>)0x81e558,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&addrOnion);
    if ((size_type *)addrOnion.proxy.super_CNetAddr.m_addr._union.indirect_contents.indirect !=
        &addrOnion.proxy.super_CNetAddr.m_addr._size) {
      operator_delete(addrOnion.proxy.super_CNetAddr.m_addr._union.indirect_contents.indirect,
                      CONCAT44(addrOnion.proxy.super_CNetAddr.m_addr._20_4_,
                               addrOnion.proxy.super_CNetAddr.m_addr._size) + 1);
    }
  }
  prevector<16U,_unsigned_char,_unsigned_int,_int>::prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&addrOnion,
             (prevector<16U,_unsigned_char,_unsigned_int,_int> *)&resolved);
  paVar2 = &addrOnion.m_unix_socket_path.field_2;
  addrOnion.proxy.super_CNetAddr.m_net = resolved.super_CNetAddr.m_net;
  addrOnion.proxy.super_CNetAddr.m_scope_id = resolved.super_CNetAddr.m_scope_id;
  addrOnion.proxy.port = resolved.port;
  addrOnion.m_unix_socket_path._M_string_length = 0;
  addrOnion.m_unix_socket_path.field_2._M_local_buf[0] = '\0';
  addrOnion.m_is_unix_socket = false;
  addrOnion.m_randomize_credentials = true;
  addrOnion.m_unix_socket_path._M_dataplus._M_p = (pointer)paVar2;
  SetProxy(NET_ONION,&addrOnion);
  ppbVar1 = &port_list.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
  port_list.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)ppbVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&port_list,"-onlynet","");
  ArgsManager::GetArgs(&onlynets,&gArgs,(string *)&port_list);
  if (port_list.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)ppbVar1) {
    operator_delete(port_list.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (ulong)((long)&((port_list.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                                   _M_dataplus)._M_p + 1));
  }
  port_list.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)ppbVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&port_list,"-onlynet","");
  bVar8 = ArgsManager::IsArgSet(&gArgs,(string *)&port_list);
  if (bVar8) {
    net_in = (string *)
             CONCAT71(onlynets.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start._1_7_,
                      onlynets.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start._0_1_);
    lVar13 = (long)onlynets.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish - (long)net_in >> 7;
    if (0 < lVar13) {
      lVar13 = lVar13 + 1;
      do {
        NVar10 = ParseNetwork(net_in);
        psVar14 = net_in;
        if (NVar10 == NET_ONION) goto LAB_003cce7e;
        NVar10 = ParseNetwork(net_in + 1);
        psVar14 = net_in + 1;
        if (NVar10 == NET_ONION) goto LAB_003cce7e;
        NVar10 = ParseNetwork(net_in + 2);
        psVar14 = net_in + 2;
        if (NVar10 == NET_ONION) goto LAB_003cce7e;
        NVar10 = ParseNetwork(net_in + 3);
        psVar14 = net_in + 3;
        if (NVar10 == NET_ONION) goto LAB_003cce7e;
        net_in = net_in + 4;
        lVar13 = lVar13 + -1;
      } while (1 < lVar13);
    }
    lVar13 = (long)onlynets.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish - (long)net_in >> 5;
    if (lVar13 == 1) {
LAB_003cce6c:
      NVar10 = ParseNetwork(net_in);
      psVar14 = net_in;
      if (NVar10 != NET_ONION) {
        psVar14 = onlynets.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      }
    }
    else if (lVar13 == 2) {
LAB_003cce5b:
      NVar10 = ParseNetwork(net_in);
      psVar14 = net_in;
      if (NVar10 != NET_ONION) {
        net_in = net_in + 1;
        goto LAB_003cce6c;
      }
    }
    else {
      psVar14 = onlynets.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      if ((lVar13 == 3) && (NVar10 = ParseNetwork(net_in), psVar14 = net_in, NVar10 != NET_ONION)) {
        net_in = net_in + 1;
        goto LAB_003cce5b;
      }
    }
LAB_003cce7e:
    if (port_list.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)ppbVar1) {
      operator_delete(port_list.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (ulong)((long)&((port_list.
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                                     _M_dataplus)._M_p + 1));
    }
    if (psVar14 ==
        onlynets.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) goto LAB_003cced0;
  }
  else if (port_list.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start != (pointer)ppbVar1) {
    operator_delete(port_list.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (ulong)((long)&((port_list.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                                   _M_dataplus)._M_p + 1));
  }
  ReachableNets::Add(&g_reachable_nets,NET_ONION);
LAB_003cced0:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&onlynets);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)addrOnion.m_unix_socket_path._M_dataplus._M_p != paVar2) {
    operator_delete(addrOnion.m_unix_socket_path._M_dataplus._M_p,
                    CONCAT71(addrOnion.m_unix_socket_path.field_2._M_allocated_capacity._1_7_,
                             addrOnion.m_unix_socket_path.field_2._M_local_buf[0]) + 1);
  }
  if (0x10 < addrOnion.proxy.super_CNetAddr.m_addr._size) {
    free(addrOnion.proxy.super_CNetAddr.m_addr._union.indirect_contents.indirect);
    addrOnion.proxy.super_CNetAddr.m_addr._union.indirect_contents.indirect = (char *)0x0;
  }
  if (0x10 < resolved.super_CNetAddr.m_addr._size) {
    free(resolved.super_CNetAddr.m_addr._union.indirect_contents.indirect);
    resolved.super_CNetAddr.m_addr._union.indirect_contents.indirect = (char *)0x0;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)socks_location._M_dataplus._M_p != &socks_location.field_2) {
    operator_delete(socks_location._M_dataplus._M_p,
                    CONCAT71(socks_location.field_2._M_allocated_capacity._1_7_,
                             socks_location.field_2._M_local_buf[0]) + 1);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar4) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void TorController::get_socks_cb(TorControlConnection& _conn, const TorControlReply& reply)
{
    // NOTE: We can only get here if -onion is unset
    std::string socks_location;
    if (reply.code == 250) {
        for (const auto& line : reply.lines) {
            if (0 == line.compare(0, 20, "net/listeners/socks=")) {
                const std::string port_list_str = line.substr(20);
                std::vector<std::string> port_list = SplitString(port_list_str, ' ');

                for (auto& portstr : port_list) {
                    if (portstr.empty()) continue;
                    if ((portstr[0] == '"' || portstr[0] == '\'') && portstr.size() >= 2 && (*portstr.rbegin() == portstr[0])) {
                        portstr = portstr.substr(1, portstr.size() - 2);
                        if (portstr.empty()) continue;
                    }
                    socks_location = portstr;
                    if (0 == portstr.compare(0, 10, "127.0.0.1:")) {
                        // Prefer localhost - ignore other ports
                        break;
                    }
                }
            }
        }
        if (!socks_location.empty()) {
            LogDebug(BCLog::TOR, "Get SOCKS port command yielded %s\n", socks_location);
        } else {
            LogPrintf("tor: Get SOCKS port command returned nothing\n");
        }
    } else if (reply.code == 510) {  // 510 Unrecognized command
        LogPrintf("tor: Get SOCKS port command failed with unrecognized command (You probably should upgrade Tor)\n");
    } else {
        LogPrintf("tor: Get SOCKS port command failed; error code %d\n", reply.code);
    }

    CService resolved;
    Assume(!resolved.IsValid());
    if (!socks_location.empty()) {
        resolved = LookupNumeric(socks_location, DEFAULT_TOR_SOCKS_PORT);
    }
    if (!resolved.IsValid()) {
        // Fallback to old behaviour
        resolved = LookupNumeric("127.0.0.1", DEFAULT_TOR_SOCKS_PORT);
    }

    Assume(resolved.IsValid());
    LogDebug(BCLog::TOR, "Configuring onion proxy for %s\n", resolved.ToStringAddrPort());
    Proxy addrOnion = Proxy(resolved, true);
    SetProxy(NET_ONION, addrOnion);

    const auto onlynets = gArgs.GetArgs("-onlynet");

    const bool onion_allowed_by_onlynet{
        !gArgs.IsArgSet("-onlynet") ||
        std::any_of(onlynets.begin(), onlynets.end(), [](const auto& n) {
            return ParseNetwork(n) == NET_ONION;
        })};

    if (onion_allowed_by_onlynet) {
        // If NET_ONION is reachable, then the below is a noop.
        //
        // If NET_ONION is not reachable, then none of -proxy or -onion was given.
        // Since we are here, then -torcontrol and -torpassword were given.
        g_reachable_nets.Add(NET_ONION);
    }
}